

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

AssertionResult __thiscall
testing::internal::
PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<testing::Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>,testing::Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>>>>
::operator()(void *this,char *value_text,
            Span<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>
            *x)

{
  bool bVar1;
  ElementsAreMatcherImpl<absl::lts_20250127::Span<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_const>const&>
  *this_00;
  AssertionResult *other;
  undefined8 extraout_RAX;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  AssertionResult AVar2;
  StringMatchResultListener listener;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  undefined1 local_378 [8];
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_370;
  MatcherBase<const_absl::lts_20250127::Span<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>_&>
  local_368;
  undefined1 local_350 [32];
  VTable local_330 [3];
  ios_base local_2c0 [264];
  undefined1 local_1b8 [16];
  pointer local_1a8;
  ios_base local_138 [272];
  
  local_1b8._0_8_ =
       (Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>
        *)0x0;
  local_1b8._8_8_ =
       (Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>
        *)0x0;
  local_1a8 = (pointer)0x0;
  std::
  vector<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>,_std::allocator<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>_>_>
  ::reserve((vector<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>,_std::allocator<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>_>_>
             *)local_1b8,2);
  CastAndAppendTransform<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_const&>
  ::operator()((Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>
                *)local_350,
               *(CastAndAppendTransform<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_const&>
                 **)(value_text + 0x20),
               *(Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>
                 **)(value_text + 0x28));
  std::
  vector<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>,_std::allocator<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>_>_>
  ::push_back((vector<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>,_std::allocator<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>_>_>
               *)local_1b8,(value_type *)local_350);
  MatcherBase<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>
  ::~MatcherBase((MatcherBase<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>
                  *)local_350);
  CastAndAppendTransform<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_const&>
  ::operator()((Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>
                *)local_350,
               *(CastAndAppendTransform<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_const&>
                 **)(value_text + 8),
               *(Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>
                 **)(value_text + 0x10));
  std::
  vector<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>,_std::allocator<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>_>_>
  ::push_back((vector<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>,_std::allocator<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>_>_>
               *)local_1b8,(value_type *)local_350);
  MatcherBase<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>
  ::~MatcherBase((MatcherBase<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>
                  *)local_350);
  this_00 = (ElementsAreMatcherImpl<absl::lts_20250127::Span<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_const>const&>
             *)operator_new(0x20);
  ElementsAreMatcherImpl<absl::lts_20250127::Span<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_const>const&>
  ::
  ElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<testing::Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_const&>*,std::vector<testing::Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_const&>,std::allocator<testing::Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_const&>>>>>
            (this_00,(__normal_iterator<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>_*,_std::vector<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>,_std::allocator<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>_>_>_>
                      )local_1b8._0_8_,
             (__normal_iterator<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>_*,_std::vector<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>,_std::allocator<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>_>_>_>
              )local_1b8._8_8_);
  local_368.vtable_ =
       (VTable *)
       MatcherBase<absl::lts_20250127::Span<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_const>const&>
       ::
       GetVTable<testing::internal::MatcherBase<absl::lts_20250127::Span<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_const>const&>::ValuePolicy<testing::MatcherInterface<absl::lts_20250127::Span<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_const>const&>const*,true>>()
       ::kVTable;
  local_368.buffer_.ptr = operator_new(0x10);
  ((local_368.buffer_.shared)->ref).super___atomic_base<int>._M_i = 1;
  *(ElementsAreMatcherImpl<absl::lts_20250127::Span<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_const>const&>
    **)(local_368.buffer_.i + 8) = this_00;
  local_368.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_018e8ea8;
  std::
  vector<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>,_std::allocator<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>_>_>
  ::~vector((vector<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>,_std::allocator<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>_>_>
             *)local_1b8);
  local_350._8_8_ = (VTable *)0x0;
  local_350._0_8_ = &PTR__MatchResultListener_01870a48;
  bVar1 = MatcherBase<const_absl::lts_20250127::Span<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>_&>
          ::MatchAndExplain(&local_368,x,(MatchResultListener *)local_350);
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Value of: ",10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"collector.Get()",0xf);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Expected: ",10);
    MatcherBase<const_absl::lts_20250127::Span<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>_&>
    ::DescribeTo(&local_368,(ostream *)&local_1a8);
    local_350._8_8_ = local_330;
    local_350._0_8_ = &PTR__StringMatchResultListener_01870a90;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_350 + 0x10));
    bVar1 = MatchPrintAndExplain<absl::lts_20250127::Span<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_const>const,absl::lts_20250127::Span<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_const>const&>
                      (x,(Matcher<const_absl::lts_20250127::Span<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>_&>
                          *)&local_368,(MatchResultListener *)local_350);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,
                 "\n  The matcher failed on the initial attempt; but passed when rerun to generate the explanation."
                 ,0x60);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n  Actual: ",0xb);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,local_398._M_dataplus._M_p,local_398._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
    }
    AssertionFailure();
    std::__cxx11::stringbuf::str();
    other = AssertionResult::operator<<((AssertionResult *)local_378,&local_398);
    AssertionResult::AssertionResult((AssertionResult *)this,other);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
    }
    if ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_370._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_370,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_370._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl);
    }
    local_350._0_8_ = &PTR__StringMatchResultListener_01870a90;
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_350 + 0x10));
    std::ios_base::~ios_base(local_2c0);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  MatcherBase<const_absl::lts_20250127::Span<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>_&>
  ::~MatcherBase(&local_368);
  AVar2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  AVar2._0_8_ = extraout_RAX;
  return AVar2;
}

Assistant:

AssertionResult operator()(const char* value_text, const T& x) const {
    // We convert matcher_ to a Matcher<const T&> *now* instead of
    // when the PredicateFormatterFromMatcher object was constructed,
    // as matcher_ may be polymorphic (e.g. NotNull()) and we won't
    // know which type to instantiate it to until we actually see the
    // type of x here.
    //
    // We write SafeMatcherCast<const T&>(matcher_) instead of
    // Matcher<const T&>(matcher_), as the latter won't compile when
    // matcher_ has type Matcher<T> (e.g. An<int>()).
    // We don't write MatcherCast<const T&> either, as that allows
    // potentially unsafe downcasting of the matcher argument.
    const Matcher<const T&> matcher = SafeMatcherCast<const T&>(matcher_);

    // The expected path here is that the matcher should match (i.e. that most
    // tests pass) so optimize for this case.
    if (matcher.Matches(x)) {
      return AssertionSuccess();
    }

    ::std::stringstream ss;
    ss << "Value of: " << value_text << "\n"
       << "Expected: ";
    matcher.DescribeTo(&ss);

    // Rerun the matcher to "PrintAndExplain" the failure.
    StringMatchResultListener listener;
    if (MatchPrintAndExplain(x, matcher, &listener)) {
      ss << "\n  The matcher failed on the initial attempt; but passed when "
            "rerun to generate the explanation.";
    }
    ss << "\n  Actual: " << listener.str();
    return AssertionFailure() << ss.str();
  }